

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ForkJoin.H
# Opt level: O0

void __thiscall
amrex::ForkJoin::
fork_join<PeleLM::diffuse_scalar_fj(amrex::Vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>const&,amrex::Vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>const&,amrex::Vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>&,amrex::Vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>const&,int,int,int,double,double,double,amrex::MultiFab_const&,int,amrex::MultiFab*const*,amrex::MultiFab*const*,int,amrex::MultiFab*,int,amrex::MultiFab_const*,int,amrex::MultiFab_const*const*,amrex::MultiFab_const*const*,int,amrex::Vector<double,std::allocator<double>>const&,int,amrex::MultiFab_const&,amrex::MultiFab_const*const*,amrex::IntVect_const&,amrex::BCRec_const&,amrex::Geometry_const&,bool,bool,amrex::Vector<int,std::allocator<int>>const&)::__0>
          (ForkJoin *this,anon_class_112_18_4e67f792 *fn)

{
  ForkJoin *in_RDI;
  anon_class_112_18_4e67f792 *unaff_retaddr;
  MPI_Comm task_comm;
  int io_rank;
  ForkJoin *in_stack_00000150;
  bool in_stack_00000187;
  ForkJoin *in_stack_00000188;
  ForkJoin *in_stack_00000570;
  ForkJoin *in_stack_000008e0;
  int in_stack_ffffffffffffff9c;
  ForkJoin *in_stack_ffffffffffffffb0;
  string local_38 [32];
  MPI_Comm local_18;
  undefined4 local_14;
  ForkJoin *f;
  
  in_RDI->flag_invoked = true;
  local_14 = 0;
  f = in_RDI;
  create_task_output_dir(in_stack_00000150);
  local_18 = split_tasks(in_stack_ffffffffffffffb0);
  copy_data_to_tasks(in_stack_000008e0);
  ParallelContext::push((MPI_Comm)((ulong)in_RDI >> 0x20),(int)in_RDI,in_stack_ffffffffffffff9c);
  get_io_filename_abi_cxx11_(in_stack_00000188,in_stack_00000187);
  set_task_output_file((string *)0x4fdf1a);
  std::__cxx11::string::~string(local_38);
  PeleLM::diffuse_scalar_fj::anon_class_112_18_4e67f792::operator()(unaff_retaddr,f);
  ParallelContext::pop();
  copy_data_from_tasks(in_stack_00000570);
  return;
}

Assistant:

void fork_join (const F &fn)
    {
        flag_invoked = true; // set invoked flag
        const int io_rank = 0; // team's sub-rank 0 does IO
        create_task_output_dir();
        MPI_Comm task_comm = split_tasks();
        copy_data_to_tasks(); // move data to local tasks
        ParallelContext::push(task_comm, task_me, io_rank);
        set_task_output_file(get_io_filename());
        fn(*this);
        ParallelContext::pop();
#ifdef BL_USE_MPI
        MPI_Comm_free(&task_comm);
#endif
        copy_data_from_tasks(); // move local data back
    }